

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<float> * __thiscall
pstd::optional<float>::operator=(optional<float> *this,optional<float> *v)

{
  bool bVar1;
  optional<float> *this_00;
  aligned_storage_t<sizeof(float),_alignof(float)> *paVar2;
  optional<float> *in_RSI;
  optional<float> *in_RDI;
  optional<float> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<float> *)ptr((optional<float> *)0x8e5877);
    paVar2 = (aligned_storage_t<sizeof(float),_alignof(float)> *)value(this_00);
    this_00->optionalValue = *paVar2;
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }